

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<double,_3,_1> __thiscall
Matrix<double,_3,_1>::operator+(Matrix<double,_3,_1> *this,Matrix<double,_3,_1> *matrix)

{
  double *pdVar1;
  ostream *poVar2;
  int row;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Matrix<double,_3,_1> MVar6;
  Matrix<double,_3,_1> local_48;
  double local_38;
  
  iVar4 = matrix->rows;
  if ((iVar4 == 0) || (iVar5 = matrix->cols, iVar5 == 0)) {
    pcVar3 = "can not plus two empty matrix!";
  }
  else {
    if ((iVar4 == this->rows) && (iVar5 == this->cols)) {
      local_48.rows = 3;
      local_48.cols = 1;
      local_48.data = (double *)operator_new__(0x18);
      if (0 < iVar4) {
        row = 0;
        do {
          if (0 < iVar5) {
            iVar4 = 0;
            do {
              pdVar1 = operator()(this,row,iVar4);
              local_38 = *pdVar1;
              pdVar1 = operator()(matrix,row,iVar4);
              SetElement(&local_48,row,iVar4,local_38 + *pdVar1);
              iVar4 = iVar4 + 1;
              iVar5 = this->cols;
            } while (iVar4 < iVar5);
            iVar4 = this->rows;
          }
          row = row + 1;
        } while (row < iVar4);
      }
      MVar6.data = local_48.data;
      MVar6.rows = local_48.rows;
      MVar6.cols = local_48.cols;
      return MVar6;
    }
    pcVar3 = "can not plus matrix with different rows/cols";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}